

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deleteUnusedVariables.cpp
# Opt level: O0

void deleteUnusedVariables(Module *module,Program *program)

{
  bool bVar1;
  uint uVar2;
  reference pIVar3;
  Value *pVVar4;
  Value *in_RSI;
  Func *in_RDI;
  StoreInst *user;
  Expr *alloca;
  Instruction *ins;
  const_iterator __end3;
  const_iterator __begin3;
  BasicBlock *__range3;
  Block *myBlock;
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  Function *__range2;
  Func *function;
  Function *func;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __end1;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  __begin1;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *__range1;
  Function *in_stack_ffffffffffffff38;
  Block *in_stack_ffffffffffffff40;
  iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_> in_stack_ffffffffffffff48;
  use_iterator_impl<llvm::Use> in_stack_ffffffffffffff58;
  Block *in_stack_ffffffffffffff60;
  Program *in_stack_ffffffffffffff68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_88;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
  local_80;
  reference local_78;
  Block *local_70;
  reference local_68;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_60;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
  local_58;
  reference local_50;
  Func *local_48;
  reference local_40;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_38;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
  local_30;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  local_28;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
  *local_18;
  
  local_28 = llvm::Module::functions((Module *)in_stack_ffffffffffffff48.end_iterator.UI.U.UI);
  local_18 = &local_28;
  local_30 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::begin(local_18);
  local_38 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>_>
             ::end(local_18);
  while (bVar1 = llvm::operator!=(&local_30,&local_38), bVar1) {
    local_40 = llvm::
               ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
               ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                            *)0x289ec9);
    local_48 = Program::getFunction(in_stack_ffffffffffffff68,(Function *)in_stack_ffffffffffffff60)
    ;
    local_50 = local_40;
    local_58.NodePtr = (node_pointer)llvm::Function::begin(in_stack_ffffffffffffff38);
    local_60.NodePtr = (node_pointer)llvm::Function::end(in_stack_ffffffffffffff38);
    while (bVar1 = llvm::operator!=(&local_58,&local_60), bVar1) {
      local_68 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                 ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                              *)0x289f3b);
      local_70 = Func::getBlock((Func *)in_stack_ffffffffffffff58.U,
                                (BasicBlock *)in_stack_ffffffffffffff48.end_iterator.UI.U.UI);
      local_78 = local_68;
      local_80.NodePtr =
           (node_pointer)llvm::BasicBlock::begin((BasicBlock *)in_stack_ffffffffffffff38);
      local_88.NodePtr =
           (node_pointer)llvm::BasicBlock::end((BasicBlock *)in_stack_ffffffffffffff38);
      while (bVar1 = llvm::operator!=(&local_80,&local_88), bVar1) {
        pIVar3 = llvm::
                 ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                 ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                              *)0x289fa1);
        uVar2 = llvm::Instruction::getOpcode((Instruction *)0x289fb0);
        if ((uVar2 == 0x1f) &&
           (bVar1 = llvm::Value::hasOneUse((Value *)in_stack_ffffffffffffff40), bVar1)) {
          in_stack_ffffffffffffff68 = (Program *)Func::getExpr(in_RDI,in_RSI);
          in_stack_ffffffffffffff48 = llvm::Value::users((Value *)in_stack_ffffffffffffff40);
          in_stack_ffffffffffffff58.U =
               (Use *)llvm::iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_>::
                      begin((iterator_range<llvm::Value::user_iterator_impl<const_llvm::User>_> *)
                            &stack0xffffffffffffff48);
          llvm::Value::user_iterator_impl<const_llvm::User>::operator*
                    ((user_iterator_impl<const_llvm::User> *)0x28a010);
          in_stack_ffffffffffffff60 =
               (Block *)llvm::dyn_cast_or_null<llvm::StoreInst,llvm::User_const>
                                  ((User *)in_stack_ffffffffffffff40);
          if ((in_stack_ffffffffffffff60 != (Block *)0x0) &&
             ((pVVar4 = llvm::StoreInst::getValueOperand((StoreInst *)0x28a031),
              pVVar4 != (Value *)pIVar3 &&
              (pVVar4 = llvm::StoreInst::getPointerOperand((StoreInst *)0x28a042),
              pVVar4 == (Value *)pIVar3)))) {
            deleteExprFromBlock(in_stack_ffffffffffffff60,(Expr *)in_stack_ffffffffffffff58.U);
            in_stack_ffffffffffffff40 = local_70;
            Func::getExpr(in_RDI,in_RSI);
            deleteExprFromBlock(in_stack_ffffffffffffff60,(Expr *)in_stack_ffffffffffffff58.U);
          }
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_true>
                      *)in_stack_ffffffffffffff40);
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
      ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_true>
                    *)in_stack_ffffffffffffff40);
    }
    llvm::
    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
    ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_true>
                  *)in_stack_ffffffffffffff40);
  }
  Program::addPass((Program *)in_stack_ffffffffffffff48.end_iterator.UI.U.UI,
                   in_stack_ffffffffffffff48.begin_iterator.UI.U._4_4_);
  return;
}

Assistant:

void deleteUnusedVariables(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateExpressions));
    for (const llvm::Function& func : module->functions()) {
        auto* function = program.getFunction(&func);
        for (const auto& block : func) {
            auto* myBlock = function->getBlock(&block);

            for (const auto& ins : block) {
                if (ins.getOpcode() == llvm::Instruction::Alloca) {
                    if (ins.hasOneUse()) {
                        auto* alloca = function->getExpr(&ins);
                        auto* user = llvm::dyn_cast_or_null<llvm::StoreInst>(*ins.users().begin());
                        if (!user) {
                            continue;
                        }

                        // make sure the allocation is only used as a target of store
                        if (user->getValueOperand() != &ins && user->getPointerOperand() == &ins) {
                            deleteExprFromBlock(myBlock, alloca);
                            deleteExprFromBlock(myBlock, function->getExpr(user));
                        }
                    }
                }
            }
        }
    }

    program.addPass(PassType::DeleteUnusedVariables);
}